

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::GenerateMergeFromMethods
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  FieldDescriptor *this_00;
  bool bVar2;
  Type TVar3;
  FieldDescriptor **ppFVar4;
  FieldGenerator *pFVar5;
  uint i;
  uint i_00;
  char *text;
  long i_01;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  scoped_array<const_google::protobuf::FieldDescriptor_*> local_58;
  string local_50;
  
  local_58.array_ = anon_unknown_0::SortFieldsByNumber(this->descriptor_);
  io::Printer::Print(printer,
                     "\n@Override\npublic $classname$ mergeFrom(\n        com.google.protobuf.nano.CodedInputByteBufferNano input)\n    throws java.io.IOException {\n"
                     ,"classname",*(string **)this->descriptor_);
  io::Printer::Indent(printer);
  bVar2 = HasMapField(this->descriptor_);
  if (bVar2) {
    io::Printer::Print(printer,
                       "com.google.protobuf.nano.MapFactories.MapFactory mapFactory =\n  com.google.protobuf.nano.MapFactories.getMapFactory();\n"
                      );
  }
  io::Printer::Print(printer,"while (true) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"int tag = input.readTag();\nswitch (tag) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"case 0:\n  return this;\ndefault: {\n");
  io::Printer::Indent(printer);
  text = 
  "if (!com.google.protobuf.nano.WireFormatNano.parseUnknownField(input, tag)) {\n  return this;\n}\n"
  ;
  if (this->params_->store_unknown_fields_ != false) {
    text = "if (!storeUnknownField(input, tag)) {\n  return this;\n}\n";
  }
  io::Printer::Print(printer,text);
  io::Printer::Print(printer,"break;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  if (0 < *(int *)(this->descriptor_ + 0x2c)) {
    i_01 = 0;
    do {
      ppFVar4 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                          (&local_58,i_01);
      this_00 = *ppFVar4;
      iVar1 = *(int *)(this_00 + 0x38);
      TVar3 = FieldDescriptor::type(this_00);
      SimpleItoa_abi_cxx11_
                (&local_50,
                 (protobuf *)
                 (ulong)(iVar1 << 3 |
                        *(uint *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)TVar3 * 4
                                 )),i);
      io::Printer::Print(printer,"case $tag$: {\n","tag",&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      io::Printer::Indent(printer);
      pFVar5 = FieldGeneratorMap::get(&this->field_generators_,this_00);
      (*pFVar5->_vptr_FieldGenerator[6])(pFVar5,printer);
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"  break;\n}\n");
      if (*(int *)(this_00 + 0x4c) == 3) {
        TVar3 = FieldDescriptor::type(this_00);
        if (TVar3 - TYPE_UINT32 < 0xfffffffc) {
          SimpleItoa_abi_cxx11_
                    (&local_50,(protobuf *)(ulong)(*(int *)(this_00 + 0x38) * 8 + 2),i_00);
          io::Printer::Print(printer,"case $tag$: {\n","tag",&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          io::Printer::Indent(printer);
          pFVar5 = FieldGeneratorMap::get(&this->field_generators_,this_00);
          (*pFVar5->_vptr_FieldGenerator[7])(pFVar5,printer);
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"  break;\n}\n");
        }
      }
      i_01 = i_01 + 1;
    } while (i_01 < *(int *)(this->descriptor_ + 0x2c));
  }
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"    }\n  }\n}\n");
  if (local_58.array_ != (FieldDescriptor **)0x0) {
    operator_delete__(local_58.array_);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateMergeFromMethods(io::Printer* printer) {
  scoped_array<const FieldDescriptor*> sorted_fields(
    SortFieldsByNumber(descriptor_));

  printer->Print(
    "\n"
    "@Override\n"
    "public $classname$ mergeFrom(\n"
    "        com.google.protobuf.nano.CodedInputByteBufferNano input)\n"
    "    throws java.io.IOException {\n",
    "classname", descriptor_->name());

  printer->Indent();
  if (HasMapField(descriptor_)) {
    printer->Print(
      "com.google.protobuf.nano.MapFactories.MapFactory mapFactory =\n"
      "  com.google.protobuf.nano.MapFactories.getMapFactory();\n");
  }

  printer->Print(
    "while (true) {\n");
  printer->Indent();

  printer->Print(
    "int tag = input.readTag();\n"
    "switch (tag) {\n");
  printer->Indent();

  printer->Print(
    "case 0:\n"          // zero signals EOF / limit reached
    "  return this;\n"
    "default: {\n");

  printer->Indent();
  if (params_.store_unknown_fields()) {
    printer->Print(
        "if (!storeUnknownField(input, tag)) {\n"
        "  return this;\n"
        "}\n");
  } else {
    printer->Print(
        "if (!com.google.protobuf.nano.WireFormatNano.parseUnknownField(input, tag)) {\n"
        "  return this;\n"   // it's an endgroup tag
        "}\n");
  }
  printer->Print("break;\n");
  printer->Outdent();
  printer->Print("}\n");

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    uint32 tag = WireFormatLite::MakeTag(field->number(),
      WireFormat::WireTypeForFieldType(field->type()));

    printer->Print(
      "case $tag$: {\n",
      "tag", SimpleItoa(tag));
    printer->Indent();

    field_generators_.get(field).GenerateMergingCode(printer);

    printer->Outdent();
    printer->Print(
      "  break;\n"
      "}\n");

    if (field->is_packable()) {
      // To make packed = true wire compatible, we generate parsing code from a
      // packed version of this field regardless of field->options().packed().
      uint32 packed_tag = WireFormatLite::MakeTag(field->number(),
        WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
      printer->Print(
        "case $tag$: {\n",
        "tag", SimpleItoa(packed_tag));
      printer->Indent();

      field_generators_.get(field).GenerateMergingCodeFromPacked(printer);

      printer->Outdent();
      printer->Print(
        "  break;\n"
        "}\n");
    }
  }

  printer->Outdent();
  printer->Outdent();
  printer->Outdent();
  printer->Print(
    "    }\n"     // switch (tag)
    "  }\n"       // while (true)
    "}\n");
}